

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal_cost.c
# Opt level: O2

void BrotliEstimateBitCostsForLiterals(size_t pos,size_t len,size_t mask,uint8_t *data,float *cost)

{
  long *plVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  byte bVar10;
  ulong *puVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  double dVar15;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  undefined8 uVar21;
  size_t in_window_utf8 [3];
  size_t histogram [3] [256];
  ulong local_1878 [4];
  double local_1858;
  undefined8 uStack_1850;
  ulong local_1848;
  size_t local_1840;
  ulong local_1838 [769];
  
  iVar4 = BrotliIsMostlyUTF8(data,pos,mask,len,0.75);
  if (iVar4 == 0) {
    memset(local_1838,0,0x800);
    uVar13 = pos;
    uVar7 = 2000;
    uVar5 = 2000;
    if (len < 2000) {
      uVar7 = len;
      uVar5 = len;
    }
    while (uVar7 != 0) {
      local_1838[data[uVar13 & mask]] = local_1838[data[uVar13 & mask]] + 1;
      uVar13 = uVar13 + 1;
      uVar7 = uVar7 - 1;
    }
    uVar13 = 0;
    local_1840 = mask;
    for (lVar8 = -2000; lVar8 - len != -2000; lVar8 = lVar8 + 1) {
      if (1999 < uVar13) {
        local_1838[data[pos - 2000 & local_1840]] = local_1838[data[pos - 2000 & local_1840]] - 1;
        uVar5 = uVar5 - 1;
      }
      if (uVar13 + 2000 < len) {
        local_1838[data[pos + 2000 & local_1840]] = local_1838[data[pos + 2000 & local_1840]] + 1;
        uVar5 = uVar5 + 1;
      }
      uVar7 = local_1838[data[pos & local_1840]];
      lVar12 = uVar7 + (uVar7 == 0);
      if (uVar5 < 0x100) {
        dVar20 = kLog2Table[uVar5];
        uVar21 = 0;
      }
      else {
        auVar18._8_4_ = (int)(uVar5 >> 0x20);
        auVar18._0_8_ = uVar5;
        auVar18._12_4_ = 0x45300000;
        dVar20 = log2((auVar18._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0));
        uVar21 = extraout_XMM0_Qb_00;
      }
      if (uVar7 < 0x100) {
        dVar15 = kLog2Table[lVar12];
      }
      else {
        auVar19._8_4_ = (int)((ulong)lVar12 >> 0x20);
        auVar19._0_8_ = lVar12;
        auVar19._12_4_ = 0x45300000;
        local_1858 = dVar20;
        uStack_1850 = uVar21;
        dVar15 = log2((auVar19._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0));
        dVar20 = local_1858;
      }
      dVar20 = (dVar20 - dVar15) + 0.029;
      cost[lVar8 + 2000] =
           (float)(double)(-(ulong)(dVar20 < 1.0) & (ulong)(dVar20 * 0.5 + 0.5) |
                          ~-(ulong)(dVar20 < 1.0) & (ulong)dVar20);
      uVar13 = uVar13 + 1;
      pos = pos + 1;
    }
  }
  else {
    local_1838[0] = 0;
    local_1878[0] = 0;
    local_1848 = 0;
    bVar10 = 0;
    for (sVar9 = 0; len != sVar9; sVar9 = sVar9 + 1) {
      bVar2 = data[pos + sVar9 & mask];
      puVar11 = local_1838;
      if ((((char)bVar2 < '\0') && (puVar11 = local_1878, bVar2 < 0xc0)) &&
         (puVar11 = local_1838, 0xdf < bVar10)) {
        puVar11 = &local_1848;
      }
      *puVar11 = *puVar11 + 1;
      bVar10 = bVar2;
    }
    uVar13 = (ulong)(0x18 < local_1878[0] + local_1848);
    memset(local_1838,0,0x1800);
    sVar9 = 0x1ef;
    if (len < 0x1ef) {
      sVar9 = len;
    }
    local_1878[2] = 0;
    local_1878[0] = 0;
    local_1878[1] = 0;
    uVar7 = 0;
    sVar6 = pos;
    uVar5 = 0;
    while (bVar14 = sVar9 != 0, sVar9 = sVar9 - 1, bVar14) {
      bVar10 = data[sVar6 & mask];
      local_1838[uVar7 * 0x100 + (ulong)bVar10] = local_1838[uVar7 * 0x100 + (ulong)bVar10] + 1;
      local_1878[uVar7] = local_1878[uVar7] + 1;
      if ((char)bVar10 < '\0') {
        uVar7 = uVar13;
        if ((bVar10 < 0xc0) && (uVar5 < 0xe0)) {
          uVar7 = 0;
        }
      }
      else {
        uVar7 = 0;
      }
      sVar6 = sVar6 + 1;
      uVar5 = (ulong)bVar10;
    }
    lVar8 = 2000;
    for (uVar7 = 0; len != uVar7; uVar7 = uVar7 + 1) {
      if (0x1ee < uVar7) {
        if (uVar7 == 0x1ef) {
LAB_0012f8d0:
          uVar5 = 0;
        }
        else {
          bVar14 = true;
          if (0x1f0 < uVar7) {
            bVar14 = data[(pos + uVar7) - 0x1f1 & mask] < 0xe0;
          }
          if (-1 < (char)data[(pos + uVar7) - 0x1f0 & mask]) goto LAB_0012f8d0;
          uVar5 = uVar13;
          if (bVar14) {
            uVar5 = 0;
          }
          if (0xbf < data[(pos + uVar7) - 0x1f0 & mask]) {
            uVar5 = uVar13;
          }
        }
        plVar1 = (long *)((long)local_1838 +
                         (ulong)data[(pos + uVar7) - 0x1ef & mask] * 8 +
                         (ulong)(uint)((int)uVar5 << 0xb));
        *plVar1 = *plVar1 + -1;
        local_1878[uVar5] = local_1878[uVar5] - 1;
      }
      if (uVar7 + 0x1ef < len) {
        if ((char)data[pos + uVar7 + 0x1ee & mask] < '\0') {
          uVar5 = uVar13;
          if ((data[pos + uVar7 + 0x1ee & mask] < 0xc0) && (data[pos + uVar7 + 0x1ed & mask] < 0xe0)
             ) {
            uVar5 = 0;
          }
        }
        else {
          uVar5 = 0;
        }
        plVar1 = (long *)((long)local_1838 +
                         (ulong)data[pos + uVar7 + 0x1ef & mask] * 8 +
                         (ulong)(uint)((int)uVar5 << 0xb));
        *plVar1 = *plVar1 + 1;
        local_1878[uVar5] = local_1878[uVar5] + 1;
      }
      if (uVar7 == 0) {
LAB_0012f9a7:
        uVar5 = 0;
      }
      else {
        bVar14 = true;
        if (uVar7 != 1) {
          bVar14 = data[(pos + uVar7) - 2 & mask] < 0xe0;
        }
        if (-1 < (char)data[(pos + uVar7) - 1 & mask]) goto LAB_0012f9a7;
        uVar5 = uVar13;
        if (bVar14) {
          uVar5 = 0;
        }
        if (0xbf < data[(pos + uVar7) - 1 & mask]) {
          uVar5 = uVar13;
        }
      }
      uVar3 = *(ulong *)((long)local_1838 +
                        (ulong)data[pos + uVar7 & mask] * 8 + (ulong)(uint)((int)uVar5 << 0xb));
      lVar12 = uVar3 + (uVar3 == 0);
      uVar5 = local_1878[uVar5];
      if (uVar5 < 0x100) {
        dVar20 = kLog2Table[uVar5];
        uVar21 = 0;
      }
      else {
        auVar16._8_4_ = (int)(uVar5 >> 0x20);
        auVar16._0_8_ = uVar5;
        auVar16._12_4_ = 0x45300000;
        dVar20 = log2((auVar16._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0));
        uVar21 = extraout_XMM0_Qb;
      }
      if (uVar3 < 0x100) {
        dVar15 = kLog2Table[lVar12];
      }
      else {
        auVar17._8_4_ = (int)((ulong)lVar12 >> 0x20);
        auVar17._0_8_ = lVar12;
        auVar17._12_4_ = 0x45300000;
        local_1858 = dVar20;
        uStack_1850 = uVar21;
        dVar15 = log2((auVar17._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0));
        dVar20 = local_1858;
      }
      dVar20 = (dVar20 - dVar15) + 0.02905;
      dVar20 = (double)(-(ulong)(dVar20 < 1.0) & (ulong)(dVar20 * 0.5 + 0.5) |
                       ~-(ulong)(dVar20 < 1.0) & (ulong)dVar20);
      if (uVar7 < 2000) {
        dVar20 = dVar20 + ((double)lVar8 / -2000.0) * 0.35 + 0.7;
      }
      cost[uVar7] = (float)dVar20;
      lVar8 = lVar8 + -1;
    }
  }
  return;
}

Assistant:

void BrotliEstimateBitCostsForLiterals(size_t pos, size_t len, size_t mask,
                                       const uint8_t* data, float* cost) {
  if (BrotliIsMostlyUTF8(data, pos, mask, len, kMinUTF8Ratio)) {
    EstimateBitCostsForLiteralsUTF8(pos, len, mask, data, cost);
    return;
  } else {
    size_t histogram[256] = { 0 };
    size_t window_half = 2000;
    size_t in_window = BROTLI_MIN(size_t, window_half, len);

    /* Bootstrap histogram. */
    size_t i;
    for (i = 0; i < in_window; ++i) {
      ++histogram[data[(pos + i) & mask]];
    }

    /* Compute bit costs with sliding window. */
    for (i = 0; i < len; ++i) {
      size_t histo;
      if (i >= window_half) {
        /* Remove a byte in the past. */
        --histogram[data[(pos + i - window_half) & mask]];
        --in_window;
      }
      if (i + window_half < len) {
        /* Add a byte in the future. */
        ++histogram[data[(pos + i + window_half) & mask]];
        ++in_window;
      }
      histo = histogram[data[(pos + i) & mask]];
      if (histo == 0) {
        histo = 1;
      }
      {
        double lit_cost = FastLog2(in_window) - FastLog2(histo);
        lit_cost += 0.029;
        if (lit_cost < 1.0) {
          lit_cost *= 0.5;
          lit_cost += 0.5;
        }
        cost[i] = (float)lit_cost;
      }
    }
  }
}